

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  bool bVar1;
  
  if ((width != 0.0) || (NAN(width))) {
    ImGui::PushItemWidth(width);
  }
  bVar1 = ImGui::InputText(label,this->InputBuf,0x100,0,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if ((width != 0.0) || (NAN(width))) {
    ImGui::PopItemWidth();
  }
  if (bVar1) {
    Build(this);
  }
  return bVar1;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::PushItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (width != 0.0f)
        ImGui::PopItemWidth();
    if (value_changed)
        Build();
    return value_changed;
}